

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *lhs;
  int iVar1;
  int iVar2;
  ImDrawList *this;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 col_upr_right;
  ImU32 col_00;
  int iVar6;
  ImGuiWindow *pIVar7;
  float _x;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  bool local_4a5;
  float local_470;
  float local_3d8;
  float local_3bc;
  float local_3b4;
  float local_3a8;
  float local_3a4;
  float local_39c;
  float local_394;
  float local_38c;
  float local_378;
  byte local_33d;
  uint local_33c;
  ImVec2 local_338;
  ImVec2 local_330;
  ImVec2 local_328;
  ImVec2 local_320;
  float local_314;
  ImVec2 IStack_310;
  float bar1_line_y;
  ImVec2 local_308;
  ImVec2 local_300;
  undefined1 local_2f8 [8];
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  ImVec2 local_2d8;
  ImVec2 local_2d0;
  ImVec2 local_2c8;
  float local_2c0;
  float bar0_line_y;
  ImVec2 local_2b4;
  int local_2ac;
  int i;
  ImVec2 local_2a0;
  ImVec2 local_298;
  ImVec2 local_290;
  ImVec2 local_288;
  ImVec2 local_280;
  ImVec2 local_278;
  ImVec2 local_270;
  ImVec2 local_268;
  ImVec2 local_260;
  ImVec2 uv_white;
  ImVec2 local_250;
  ImVec2 trc;
  ImVec2 local_240;
  ImVec2 trb;
  ImVec2 local_230;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 local_1fc;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 hue_colors [7];
  ImU32 col32_no_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward;
  undefined1 local_168 [8];
  ImVec4 ref_col_v4;
  undefined1 local_150 [8];
  ImVec4 col_v4;
  char *label_display_end;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  float local_110;
  float local_10c;
  float ww;
  float vv;
  float uu;
  ImVec2 local_fc;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  bool local_c7;
  bool local_c6;
  bool local_c5;
  float local_c4;
  bool value_changed_sv;
  bool value_changed_h;
  float fStack_c0;
  bool value_changed;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *ref_col_local;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar4 = GImGui;
  pIVar7 = GetCurrentWindow();
  this = pIVar7->DrawList;
  PushID(label);
  BeginGroup();
  ref_col_local._4_4_ = flags;
  if ((flags & 0x100U) == 0) {
    ref_col_local._4_4_ = flags | 0x10;
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ColorPickerOptionsPopup(ref_col_local._4_4_,col);
  }
  if ((ref_col_local._4_4_ & 0x6000000) == 0) {
    if ((pIVar4->ColorEditOptions & 0x6000000U) == 0) {
      local_33c = 0x2900000;
    }
    else {
      local_33c = pIVar4->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_33c & 0x6000000 | ref_col_local._4_4_;
  }
  bVar5 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x6000000);
  if (!bVar5) {
    __assert_fail("ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2f9b,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ref_col_local._4_4_ = pIVar4->ColorEditOptions & 0x10000U | ref_col_local._4_4_;
  }
  picker_pos.y = 5.60519e-45;
  if ((ref_col_local._4_4_ & 2) != 0) {
    picker_pos.y = 4.2039e-45;
  }
  local_33d = 0;
  if ((ref_col_local._4_4_ & 0x10000) != 0) {
    local_33d = (ref_col_local._4_4_ & 2) != 0 ^ 0xff;
  }
  picker_pos.x._3_1_ = local_33d & 1;
  _bars_width = (pIVar7->DC).CursorPos;
  _x = GetFrameHeight();
  fVar8 = CalcItemWidth();
  iVar6 = 1;
  if ((picker_pos.x._3_1_ & 1) != 0) {
    iVar6 = 2;
  }
  fVar8 = ImMax<float>(_x * 1.0,-(float)iVar6 * (_x + (pIVar4->Style).ItemInnerSpacing.x) + fVar8);
  fVar9 = bars_width + fVar8 + (pIVar4->Style).ItemInnerSpacing.x;
  backup_initial_col[3] = fVar9 + _x + (pIVar4->Style).ItemInnerSpacing.x;
  backup_initial_col[2] = (float)(int)(_x * 0.2);
  memcpy(&wheel_r_outer,col,(long)(int)picker_pos.y << 2);
  local_3d8 = fVar8 * 0.08;
  fVar10 = fVar8 * 0.5;
  fVar11 = fVar10 - local_3d8;
  ImVec2::ImVec2((ImVec2 *)&triangle_pa.y,(fVar8 + _x) * 0.5 + bars_width,fVar8 * 0.5 + square_sz);
  triangle_pa.x = fVar11 - (float)(int)(fVar8 * 0.027);
  ImVec2::ImVec2(&triangle_pb,triangle_pa.x,0.0);
  ImVec2::ImVec2(&triangle_pc,triangle_pa.x * -0.5,triangle_pa.x * -0.866025);
  ImVec2::ImVec2((ImVec2 *)&S,triangle_pa.x * -0.5,triangle_pa.x * 0.866025);
  ColorConvertRGBtoHSV(*col,col[1],col[2],&V,&stack0xffffffffffffff40,&local_c4);
  local_c5 = false;
  local_c6 = false;
  local_c7 = false;
  PushItemFlag(8,true);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_118,fVar8,fVar8);
      InvisibleButton("sv",&local_118);
      local_c7 = IsItemActive();
      if (local_c7) {
        fStack_c0 = ImSaturate(((pIVar4->IO).MousePos.x - bars_width) / (fVar8 - 1.0));
        local_c4 = ImSaturate(((pIVar4->IO).MousePos.y - square_sz) / (fVar8 - 1.0));
        local_c4 = 1.0 - local_c4;
      }
      if ((ref_col_local._4_4_ & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      ImVec2::ImVec2(&local_120,fVar9,square_sz);
      SetCursorScreenPos(&local_120);
      ImVec2::ImVec2(&local_128,_x,fVar8);
      InvisibleButton("hue",&local_128);
      local_c6 = IsItemActive();
      local_c5 = local_c7;
      if (local_c6) {
        V = ImSaturate(((pIVar4->IO).MousePos.y - square_sz) / (fVar8 - 1.0));
        local_c5 = true;
      }
    }
  }
  else {
    ImVec2::ImVec2(&initial_off,fVar8 + (pIVar4->Style).ItemInnerSpacing.x + _x,fVar8);
    InvisibleButton("hsv",&initial_off);
    bVar5 = IsItemActive();
    if (bVar5) {
      current_off = ::operator-((pIVar4->IO).MouseClickedPos,(ImVec2 *)&triangle_pa.y);
      _cos_hue_angle = ::operator-(&(pIVar4->IO).MousePos,(ImVec2 *)&triangle_pa.y);
      fVar12 = ImLengthSqr(&current_off);
      if (((fVar11 - 1.0) * (fVar11 - 1.0) <= fVar12) && (fVar12 <= (fVar10 + 1.0) * (fVar10 + 1.0))
         ) {
        fVar12 = ImAtan2(initial_dist2,cos_hue_angle);
        V = (fVar12 / 3.1415927) * 0.5;
        if (V < 0.0) {
          V = V + 1.0;
        }
        local_c6 = true;
        local_c5 = true;
      }
      fVar12 = ImCos((-V - V) * 3.1415927);
      fVar13 = ImSin((-V - V) * 3.1415927);
      current_off_unrotated = ImRotate(&current_off,fVar12,fVar13);
      bVar5 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&current_off_unrotated)
      ;
      if (bVar5) {
        local_fc = ImRotate((ImVec2 *)&cos_hue_angle,fVar12,fVar13);
        bVar5 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_fc);
        if (!bVar5) {
          _vv = ImTriangleClosestPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_fc);
          local_fc = _vv;
        }
        ImTriangleBarycentricCoords
                  (&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_fc,&ww,&local_10c,&local_110);
        local_c4 = ImClamp<float>(1.0 - local_10c,0.0001,1.0);
        fStack_c0 = ImClamp<float>(ww / local_c4,0.0001,1.0);
        local_c7 = true;
        local_c5 = true;
      }
    }
    if ((ref_col_local._4_4_ & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  if ((picker_pos.x._3_1_ & 1) != 0) {
    ImVec2::ImVec2(&local_130,backup_initial_col[3],square_sz);
    SetCursorScreenPos(&local_130);
    ImVec2::ImVec2((ImVec2 *)&label_display_end,_x,fVar8);
    InvisibleButton("alpha",(ImVec2 *)&label_display_end);
    bVar5 = IsItemActive();
    if (bVar5) {
      fVar12 = ImSaturate(((pIVar4->IO).MousePos.y - square_sz) / (fVar8 - 1.0));
      col[3] = 1.0 - fVar12;
      local_c5 = true;
    }
  }
  PopItemFlag();
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (((ref_col_local._4_4_ & 0x80) == 0) &&
     (col_v4._8_8_ = FindRenderedTextEnd(label,(char *)0x0), label != (char *)col_v4._8_8_)) {
    if ((ref_col_local._4_4_ & 0x100) != 0) {
      SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
    }
    TextUnformatted(label,(char *)col_v4._8_8_);
  }
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    PushItemFlag(0x10,true);
    if ((ref_col_local._4_4_ & 2) == 0) {
      local_378 = col[3];
    }
    else {
      local_378 = 1.0;
    }
    ImVec4::ImVec4((ImVec4 *)local_150,*col,col[1],col[2],local_378);
    if ((ref_col_local._4_4_ & 0x80) != 0) {
      Text("Current");
    }
    ImVec2::ImVec2((ImVec2 *)&ref_col_v4.z,_x * 3.0,_x + _x);
    ColorButton("##current",(ImVec4 *)local_150,ref_col_local._4_4_ & 0xe0040,
                (ImVec2)ref_col_v4._8_8_);
    if (ref_col != (float *)0x0) {
      Text("Original");
      if ((ref_col_local._4_4_ & 2) == 0) {
        local_38c = ref_col[3];
      }
      else {
        local_38c = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)local_168,*ref_col,ref_col[1],ref_col[2],local_38c);
      ImVec2::ImVec2((ImVec2 *)&sub_flags,_x * 3.0,_x + _x);
      bVar5 = ColorButton("##original",(ImVec4 *)local_168,ref_col_local._4_4_ & 0xe0040,_sub_flags)
      ;
      if (bVar5) {
        memcpy(col,ref_col,(long)(int)picker_pos.y << 2);
        local_c5 = true;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if ((local_c6 != false) || (local_c7 != false)) {
    if (V < 1.0) {
      local_394 = V;
    }
    else {
      local_394 = V - 1e-05;
    }
    if (fStack_c0 <= 0.0) {
      local_39c = 1e-05;
    }
    else {
      local_39c = fStack_c0;
    }
    if (local_c4 <= 0.0) {
      local_3a4 = 1e-06;
    }
    else {
      local_3a4 = local_c4;
    }
    ColorConvertHSVtoRGB(local_394,local_39c,local_3a4,col,col + 1,col + 2);
  }
  if ((ref_col_local._4_4_ & 0x20) == 0) {
    local_3a8 = fVar9;
    if ((picker_pos.x._3_1_ & 1) != 0) {
      local_3a8 = backup_initial_col[3];
    }
    PushItemWidth((local_3a8 + _x) - bars_width);
    new_H = 5.216271e-38;
    new_S = (float)(ref_col_local._4_4_ & 0x18e001a | 4);
    if (((ref_col_local._4_4_ & 0x100000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar5 = ColorEdit4("##rgb",col,ref_col_local._4_4_ & 0x18e001a | 0x100004);
      local_c5 = local_c5 != false || bVar5;
    }
    if (((ref_col_local._4_4_ & 0x200000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar5 = ColorEdit4("##hsv",col,(uint)new_S | 0x200000);
      local_c5 = local_c5 != false || bVar5;
    }
    if (((ref_col_local._4_4_ & 0x400000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar5 = ColorEdit4("##hex",col,(uint)new_S | 0x400000);
      local_c5 = local_c5 != false || bVar5;
    }
    PopItemWidth();
  }
  if (((local_c5 != false) &&
      (ColorConvertRGBtoHSV(*col,col[1],col[2],&new_V,&hue_color_f.w,&hue_color_f.z), new_V <= 0.0))
     && (0.0 < V)) {
    if (hue_color_f.z <= 0.0) {
      if ((local_c4 != hue_color_f.z) || (NAN(local_c4) || NAN(hue_color_f.z))) {
        if (0.0 < hue_color_f.z) {
          local_3b4 = hue_color_f.z;
        }
        else {
          local_3b4 = local_c4 * 0.5;
        }
        ColorConvertHSVtoRGB(V,fStack_c0,local_3b4,col,col + 1,col + 2);
        goto LAB_001e9027;
      }
    }
    if (hue_color_f.w <= 0.0) {
      if (0.0 < hue_color_f.w) {
        local_3bc = hue_color_f.w;
      }
      else {
        local_3bc = fStack_c0 * 0.5;
      }
      ColorConvertHSVtoRGB(V,local_3bc,hue_color_f.z,col,col + 1,col + 2);
    }
  }
LAB_001e9027:
  ImVec4::ImVec4((ImVec4 *)&col32_no_alpha,1.0,1.0,1.0,1.0);
  ColorConvertHSVtoRGB(V,1.0,1.0,(float *)&col32_no_alpha,(float *)&hue_color32,&hue_color_f.x);
  col_upr_right = ColorConvertFloat4ToU32((ImVec4 *)&col32_no_alpha);
  ImVec4::ImVec4((ImVec4 *)(hue_colors + 5),*col,col[1],col[2],1.0);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)(hue_colors + 5));
  sv_cursor_pos.x = -1.7014636e+38;
  sv_cursor_pos.y = -1.714704e+38;
  hue_colors[0] = 0xff00ff00;
  hue_colors[1] = 0xffffff00;
  hue_colors[2] = 0xffff0000;
  hue_colors[3] = 0xffff00ff;
  hue_colors[4] = 0xff0000ff;
  ImVec2::ImVec2((ImVec2 *)&segment_per_arc);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_280,fVar8,fVar8);
      local_278 = ::operator+((ImVec2 *)&bars_width,&local_280);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_278,0xffffffff,col_upr_right,col_upr_right,
                 0xffffffff);
      ImVec2::ImVec2(&local_290,fVar8,fVar8);
      local_288 = ::operator+((ImVec2 *)&bars_width,&local_290);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_288,0,0,0xff000000,0xff000000);
      local_298 = _bars_width;
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd58,fVar8,fVar8);
      local_2a0 = ::operator+((ImVec2 *)&bars_width,(ImVec2 *)&stack0xfffffffffffffd58);
      RenderFrameBorder(local_298,local_2a0,0.0);
      fVar10 = bars_width;
      fVar11 = ImSaturate(fStack_c0);
      segment_per_arc =
           (int)ImClamp<float>((float)(int)(fVar11 * fVar8 + fVar10 + 0.5),bars_width + 2.0,
                               (bars_width + fVar8) - 2.0);
      fVar10 = square_sz;
      fVar11 = ImSaturate(1.0 - local_c4);
      fVar10 = ImClamp<float>((float)(int)(fVar11 * fVar8 + fVar10 + 0.5),square_sz + 2.0,
                              (square_sz + fVar8) - 2.0);
      aeps = fVar10;
      for (local_2ac = 0; local_2ac < 6; local_2ac = local_2ac + 1) {
        ImVec2::ImVec2(&local_2b4,fVar9,(float)local_2ac * (fVar8 / 6.0) + square_sz);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd44,fVar9 + _x,
                       (float)(local_2ac + 1) * (fVar8 / 6.0) + square_sz);
        ImDrawList::AddRectFilledMultiColor
                  (this,&local_2b4,(ImVec2 *)&stack0xfffffffffffffd44,
                   hue_colors[(long)local_2ac + -2],hue_colors[(long)local_2ac + -2],
                   hue_colors[(long)(local_2ac + 1) + -2],hue_colors[(long)(local_2ac + 1) + -2]);
      }
      local_2c0 = (float)(int)(V * fVar8 + square_sz + 0.5);
      ImVec2::ImVec2(&local_2c8,fVar9,square_sz);
      ImVec2::ImVec2(&local_2d0,fVar9 + _x,square_sz + fVar8);
      RenderFrameBorder(local_2c8,local_2d0,0.0);
      ImVec2::ImVec2(&local_2d8,fVar9 - 1.0,local_2c0);
      ImVec2::ImVec2((ImVec2 *)&alpha,backup_initial_col[2] + 1.0,backup_initial_col[2]);
      RenderArrowsForVerticalBar(this,local_2d8,_alpha,_x + 2.0);
    }
  }
  else {
    iVar6 = ImMax<int>(4,(int)fVar10 / 0xc);
    for (a1 = 0.0; (int)a1 < 6; a1 = (float)((int)a1 + 1)) {
      fVar12 = ((float)(int)a1 / 6.0 + (float)(int)a1 / 6.0) * 3.1415927 - 1.5 / fVar10;
      fVar9 = ((float)(int)a1 + 1.0) / 6.0;
      fVar13 = (fVar9 + fVar9) * 3.1415927 + 1.5 / fVar10;
      iVar1 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo
                (this,(ImVec2 *)&triangle_pa.y,(fVar11 + fVar10) * 0.5,fVar12,fVar13,iVar6);
      ImDrawList::PathStroke(this,0xffffffff,false,local_3d8);
      fVar9 = triangle_pa.y;
      iVar2 = (this->VtxBuffer).Size;
      fVar14 = ImCos(fVar12);
      fVar12 = ImSin(fVar12);
      ImVec2::ImVec2(&gradient_p1,fVar14 * fVar11 + fVar9,fVar12 * fVar11 + triangle_r);
      fVar9 = triangle_pa.y;
      fVar12 = ImCos(fVar13);
      fVar13 = ImSin(fVar13);
      ImVec2::ImVec2(&local_1fc,fVar12 * fVar11 + fVar9,fVar13 * fVar11 + triangle_r);
      pIVar3 = (this->VtxBuffer).Data;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3 + iVar1,pIVar3 + iVar2,gradient_p1,local_1fc,hue_colors[(long)(int)a1 + -2],
                 hue_colors[(long)(int)a1 + -1]);
    }
    hue_cursor_pos.y = ImCos(V * 2.0 * 3.1415927);
    hue_cursor_pos.x = ImSin(V * 2.0 * 3.1415927);
    ImVec2::ImVec2((ImVec2 *)&hue_cursor_segments,
                   hue_cursor_pos.y * (fVar11 + fVar10) * 0.5 + triangle_pa.y,
                   hue_cursor_pos.x * (fVar11 + fVar10) * 0.5 + triangle_r);
    if (local_c6 == false) {
      local_3d8 = local_3d8 * 0.55;
    }
    else {
      local_3d8 = local_3d8 * 0.65;
    }
    tra.y = local_3d8;
    tra.x = (float)ImClamp<int>((int)(local_3d8 / 1.4),9,0x20);
    ImDrawList::AddCircleFilled(this,(ImVec2 *)&hue_cursor_segments,tra.y,col_upr_right,(int)tra.x);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y + 1.0,0xff808080,(int)tra.x,1.0)
    ;
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y,0xffffffff,(int)tra.x,1.0);
    trb = ImRotate(&triangle_pb,hue_cursor_pos.y,hue_cursor_pos.x);
    lhs = &triangle_pa.y;
    local_230 = ::operator+((ImVec2 *)lhs,&trb);
    trc = ImRotate(&triangle_pc,hue_cursor_pos.y,hue_cursor_pos.x);
    local_240 = ::operator+((ImVec2 *)lhs,&trc);
    uv_white = ImRotate((ImVec2 *)&S,hue_cursor_pos.y,hue_cursor_pos.x);
    local_250 = ::operator+((ImVec2 *)lhs,&uv_white);
    local_260 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(this,6,6);
    ImDrawList::PrimVtx(this,&local_230,&local_260,col_upr_right);
    ImDrawList::PrimVtx(this,&local_240,&local_260,col_upr_right);
    ImDrawList::PrimVtx(this,&local_250,&local_260,0xffffffff);
    ImDrawList::PrimVtx(this,&local_230,&local_260,0);
    ImDrawList::PrimVtx(this,&local_240,&local_260,0xff000000);
    ImDrawList::PrimVtx(this,&local_250,&local_260,0);
    ImDrawList::AddTriangle(this,&local_230,&local_240,&local_250,0xff808080,1.5);
    fVar9 = ImSaturate(fStack_c0);
    local_270 = ImLerp(&local_250,&local_230,fVar9);
    fVar9 = ImSaturate(1.0 - local_c4);
    local_268 = ImLerp(&local_270,&local_240,fVar9);
    _segment_per_arc = local_268;
  }
  local_470 = 10.0;
  if (local_c7 == false) {
    local_470 = 6.0;
  }
  bar1_bb.Max.y = local_470;
  ImDrawList::AddCircleFilled(this,(ImVec2 *)&segment_per_arc,local_470,col_00,0xc);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y,0xffffffff,0xc,1.0);
  if ((picker_pos.x._3_1_ & 1) != 0) {
    bar1_bb.Max.x = ImSaturate(col[3]);
    ImRect::ImRect((ImRect *)local_2f8,backup_initial_col[3],square_sz,backup_initial_col[3] + _x,
                   square_sz + fVar8);
    local_300.x = (float)local_2f8._0_4_;
    local_300.y = (float)local_2f8._4_4_;
    local_308 = bar1_bb.Min;
    fVar9 = ImRect::GetWidth((ImRect *)local_2f8);
    ImVec2::ImVec2(&stack0xfffffffffffffcf0,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard(local_300,local_308,0,fVar9 * 0.5,IStack_310,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_2f8,&bar1_bb.Min,col_00,col_00,col_00 & 0xffffff,
               col_00 & 0xffffff);
    local_314 = (float)(int)((1.0 - bar1_bb.Max.x) * fVar8 + square_sz + 0.5);
    local_320.x = (float)local_2f8._0_4_;
    local_320.y = (float)local_2f8._4_4_;
    local_328 = bar1_bb.Min;
    RenderFrameBorder((ImVec2)local_2f8,bar1_bb.Min,0.0);
    ImVec2::ImVec2(&local_330,backup_initial_col[3] - 1.0,local_314);
    ImVec2::ImVec2(&local_338,backup_initial_col[2] + 1.0,backup_initial_col[2]);
    RenderArrowsForVerticalBar(this,local_330,local_338,_x + 2.0);
  }
  EndGroup();
  PopID();
  local_4a5 = false;
  if (local_c5 != false) {
    iVar6 = memcmp(&wheel_r_outer,col,(long)(int)picker_pos.y << 2);
    local_4a5 = iVar6 != 0;
  }
  return local_4a5;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(flags, col);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB);
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit), if any
    if (value_changed)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list->VtxBuffer.Data + vert_start_idx, draw_list->VtxBuffer.Data + vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();
    PopID();

    return value_changed && memcmp(backup_initial_col, col, components * sizeof(float));
}